

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O2

BVHAggregate *
pbrt::BVHAggregate::Create
          (vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *prims,
          ParameterDictionary *parameters)

{
  bool bVar1;
  int maxPrimsInNode;
  BVHAggregate *this;
  SplitMethod splitMethod;
  allocator<char> local_9a;
  allocator<char> local_99;
  string local_98;
  string splitMethodName;
  string local_58;
  _Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"splitmethod",&local_99);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"sah",&local_9a);
  ParameterDictionary::GetOneString(&splitMethodName,parameters,&local_98,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_98);
  bVar1 = std::operator==(&splitMethodName,"sah");
  splitMethod = SAH;
  if (!bVar1) {
    bVar1 = std::operator==(&splitMethodName,"hlbvh");
    if (bVar1) {
      splitMethod = HLBVH;
    }
    else {
      bVar1 = std::operator==(&splitMethodName,"middle");
      if (bVar1) {
        splitMethod = Middle;
      }
      else {
        bVar1 = std::operator==(&splitMethodName,"equal");
        if (bVar1) {
          splitMethod = EqualCounts;
        }
        else {
          Warning<std::__cxx11::string&>
                    ("BVH split method \"%s\" unknown.  Using \"sah\".",&splitMethodName);
          splitMethod = SAH;
        }
      }
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"maxnodeprims",(allocator<char> *)&local_58);
  maxPrimsInNode = ParameterDictionary::GetOneInt(parameters,&local_98,4);
  std::__cxx11::string::~string((string *)&local_98);
  this = (BVHAggregate *)operator_new(0x30);
  local_38._M_impl.super__Vector_impl_data._M_start =
       (prims->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>).
       _M_impl.super__Vector_impl_data._M_start;
  local_38._M_impl.super__Vector_impl_data._M_finish =
       (prims->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage =
       (prims->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>).
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (prims->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (prims->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)SUB168(ZEXT816(0) << 0x20,0);
  (prims->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)SUB168(ZEXT816(0) << 0x20,8);
  BVHAggregate(this,(vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
                    &local_38,maxPrimsInNode,splitMethod);
  std::_Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::~_Vector_base
            (&local_38);
  std::__cxx11::string::~string((string *)&splitMethodName);
  return this;
}

Assistant:

BVHAggregate *BVHAggregate::Create(std::vector<PrimitiveHandle> prims,
                                   const ParameterDictionary &parameters) {
    std::string splitMethodName = parameters.GetOneString("splitmethod", "sah");
    BVHAggregate::SplitMethod splitMethod;
    if (splitMethodName == "sah")
        splitMethod = BVHAggregate::SplitMethod::SAH;
    else if (splitMethodName == "hlbvh")
        splitMethod = BVHAggregate::SplitMethod::HLBVH;
    else if (splitMethodName == "middle")
        splitMethod = BVHAggregate::SplitMethod::Middle;
    else if (splitMethodName == "equal")
        splitMethod = BVHAggregate::SplitMethod::EqualCounts;
    else {
        Warning(R"(BVH split method "%s" unknown.  Using "sah".)", splitMethodName);
        splitMethod = BVHAggregate::SplitMethod::SAH;
    }

    int maxPrimsInNode = parameters.GetOneInt("maxnodeprims", 4);
    return new BVHAggregate(std::move(prims), maxPrimsInNode, splitMethod);
}